

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_converter.hpp
# Opt level: O3

string * __thiscall
trial::protocol::json::detail::string_converter<char,long_double>::encode_abi_cxx11_
          (string *__return_storage_ptr__,string_converter<char,long_double> *this,longdouble value)

{
  uint *puVar1;
  string work;
  ostringstream stream;
  locale local_1c0 [8];
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  longdouble local_194;
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  local_194 = value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  std::locale::classic();
  std::ios::imbue(local_1c0);
  std::locale::~locale(local_1c0);
  puVar1 = (uint *)((long)auStack_170 + *(long *)(local_188 + -0x18));
  *puVar1 = *puVar1 | 0x400;
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 0x12;
  std::ostream::_M_insert<long_double>(local_194);
  std::__cxx11::stringbuf::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,local_1b8,local_1b0 + (long)local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

static string encode(long double value)
    {
        // Workaround for CharT = unsigned char, which std::locale does not support
        std::ostringstream stream;
        stream.imbue(std::locale::classic());
        stream << std::showpoint << std::setprecision(std::numeric_limits<long double>::digits10) << value;
        std::string work = stream.str();
        return {work.begin(), work.end()};
    }